

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::OrientedDiscMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined4 uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  Primitive *local_348;
  undefined1 local_340 [32];
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar9 = context->scene;
  uVar24 = Disc->sharedGeomID;
  uVar25 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[uVar24].ptr;
  lVar11 = *(long *)&pGVar10->field_0x58;
  _Var12 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar32 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar28 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar35._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar28);
  auVar35._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar25);
  uVar30 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar30);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar32);
  uVar26 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar34 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar27);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar26);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar33);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar34);
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var13 = pGVar10[1].intersectionFilterN;
  lVar31 = uVar30 * (long)p_Var13;
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar11 + uVar28 * (long)p_Var13);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar25 * (long)p_Var13);
  auVar53._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31);
  auVar53._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar32 * (long)p_Var13);
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar11 + uVar27 * (long)p_Var13);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar26 * (long)p_Var13);
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar11 + (long)p_Var13 * uVar33);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar34 * (long)p_Var13);
  auVar43 = vunpcklps_avx(auVar35,auVar39);
  local_2e0 = vunpckhps_avx(auVar35,auVar39);
  auVar35 = vunpcklps_avx(auVar37,auVar41);
  auVar23 = vunpckhps_avx(auVar37,auVar41);
  auVar40 = vunpcklps_avx(auVar43,auVar35);
  auVar46 = vunpckhps_avx(auVar43,auVar35);
  local_340 = vunpcklps_avx(local_2e0,auVar23);
  auVar37 = vunpcklps_avx(auVar50,auVar55);
  auVar43 = vunpckhps_avx(auVar50,auVar55);
  auVar39 = vunpcklps_avx(auVar53,auVar56);
  auVar35 = vunpckhps_avx(auVar53,auVar56);
  local_260 = vunpcklps_avx(auVar43,auVar35);
  local_280 = vunpcklps_avx(auVar37,auVar39);
  local_1c0 = vunpckhps_avx(auVar37,auVar39);
  local_2b0 = vshufps_avx(ZEXT416(uVar24),ZEXT416(uVar24),0);
  local_2c0 = local_2b0;
  fVar1 = *(float *)(ray + k * 4 + 0x20);
  auVar51._4_4_ = fVar1;
  auVar51._0_4_ = fVar1;
  auVar51._8_4_ = fVar1;
  auVar51._12_4_ = fVar1;
  auVar51._16_4_ = fVar1;
  auVar51._20_4_ = fVar1;
  auVar51._24_4_ = fVar1;
  auVar51._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar42._0_4_ = fVar2 * local_280._0_4_ + fVar3 * local_1c0._0_4_ + fVar4 * local_260._0_4_;
  auVar42._4_4_ = fVar2 * local_280._4_4_ + fVar3 * local_1c0._4_4_ + fVar4 * local_260._4_4_;
  auVar42._8_4_ = fVar2 * local_280._8_4_ + fVar3 * local_1c0._8_4_ + fVar4 * local_260._8_4_;
  auVar42._12_4_ = fVar2 * local_280._12_4_ + fVar3 * local_1c0._12_4_ + fVar4 * local_260._12_4_;
  auVar42._16_4_ = fVar2 * local_280._16_4_ + fVar3 * local_1c0._16_4_ + fVar4 * local_260._16_4_;
  auVar42._20_4_ = fVar2 * local_280._20_4_ + fVar3 * local_1c0._20_4_ + fVar4 * local_260._20_4_;
  auVar42._24_4_ = fVar2 * local_280._24_4_ + fVar3 * local_1c0._24_4_ + fVar4 * local_260._24_4_;
  auVar42._28_4_ = 0;
  auVar35 = vcmpps_avx(ZEXT432(0) << 0x20,auVar42,0);
  auVar22 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar57._16_16_ = auVar22;
  auVar57._0_16_ = auVar22;
  auVar43 = vcvtdq2ps_avx(auVar57);
  auVar37 = vcmpps_avx(_DAT_01f7b060,auVar43,1);
  auVar58._8_4_ = 0x3f800000;
  auVar58._0_8_ = 0x3f8000003f800000;
  auVar58._12_4_ = 0x3f800000;
  auVar58._16_4_ = 0x3f800000;
  auVar58._20_4_ = 0x3f800000;
  auVar58._24_4_ = 0x3f800000;
  auVar58._28_4_ = 0x3f800000;
  auVar43 = vblendvps_avx(auVar42,auVar58,auVar35);
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  auVar59._4_4_ = fVar5;
  auVar59._0_4_ = fVar5;
  auVar59._8_4_ = fVar5;
  auVar59._12_4_ = fVar5;
  auVar59._16_4_ = fVar5;
  auVar59._20_4_ = fVar5;
  auVar59._24_4_ = fVar5;
  auVar59._28_4_ = fVar5;
  auVar35 = vandnps_avx(auVar35,auVar37);
  auVar37 = vsubps_avx(local_340,auVar59);
  auVar50 = local_260;
  auVar39 = vsubps_avx(auVar46,auVar51);
  fVar6 = *(float *)(ray + k * 4);
  auVar60._4_4_ = fVar6;
  auVar60._0_4_ = fVar6;
  auVar60._8_4_ = fVar6;
  auVar60._12_4_ = fVar6;
  auVar60._16_4_ = fVar6;
  auVar60._20_4_ = fVar6;
  auVar60._24_4_ = fVar6;
  auVar60._28_4_ = fVar6;
  auVar41 = vsubps_avx(auVar40,auVar60);
  auVar42 = local_280;
  auVar44._0_4_ =
       auVar39._0_4_ * local_1c0._0_4_ + auVar37._0_4_ * local_260._0_4_ +
       local_280._0_4_ * auVar41._0_4_;
  auVar44._4_4_ =
       auVar39._4_4_ * local_1c0._4_4_ + auVar37._4_4_ * local_260._4_4_ +
       local_280._4_4_ * auVar41._4_4_;
  auVar44._8_4_ =
       auVar39._8_4_ * local_1c0._8_4_ + auVar37._8_4_ * local_260._8_4_ +
       local_280._8_4_ * auVar41._8_4_;
  auVar44._12_4_ =
       auVar39._12_4_ * local_1c0._12_4_ + auVar37._12_4_ * local_260._12_4_ +
       local_280._12_4_ * auVar41._12_4_;
  auVar44._16_4_ =
       auVar39._16_4_ * local_1c0._16_4_ + auVar37._16_4_ * local_260._16_4_ +
       local_280._16_4_ * auVar41._16_4_;
  auVar44._20_4_ =
       auVar39._20_4_ * local_1c0._20_4_ + auVar37._20_4_ * local_260._20_4_ +
       local_280._20_4_ * auVar41._20_4_;
  auVar44._24_4_ =
       auVar39._24_4_ * local_1c0._24_4_ + auVar37._24_4_ * local_260._24_4_ +
       local_280._24_4_ * auVar41._24_4_;
  auVar44._28_4_ = auVar39._28_4_ + auVar37._28_4_ + auVar41._28_4_;
  local_200 = vdivps_avx(auVar44,auVar43);
  uVar29 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar43._4_4_ = uVar29;
  auVar43._0_4_ = uVar29;
  auVar43._8_4_ = uVar29;
  auVar43._12_4_ = uVar29;
  auVar43._16_4_ = uVar29;
  auVar43._20_4_ = uVar29;
  auVar43._24_4_ = uVar29;
  auVar43._28_4_ = uVar29;
  uVar29 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_2a0._4_4_ = uVar29;
  local_2a0._0_4_ = uVar29;
  local_2a0._8_4_ = uVar29;
  local_2a0._12_4_ = uVar29;
  local_2a0._16_4_ = uVar29;
  local_2a0._20_4_ = uVar29;
  local_2a0._24_4_ = uVar29;
  local_2a0._28_4_ = uVar29;
  auVar43 = vcmpps_avx(auVar43,local_200,2);
  auVar37 = vcmpps_avx(local_200,local_2a0,2);
  auVar43 = vandps_avx(auVar43,auVar37);
  auVar39 = auVar35 & auVar43;
  if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar39 >> 0x7f,0) != '\0') ||
        (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar39 >> 0xbf,0) != '\0') ||
      (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar39[0x1f] < '\0') {
    auVar43 = vandps_avx(auVar35,auVar43);
    auVar41 = vunpckhps_avx(local_2e0,auVar23);
    fVar14 = local_200._0_4_;
    fVar15 = local_200._4_4_;
    fVar16 = local_200._8_4_;
    fVar17 = local_200._12_4_;
    fVar18 = local_200._16_4_;
    fVar19 = local_200._20_4_;
    fVar20 = local_200._24_4_;
    auVar45._0_4_ = fVar6 + fVar2 * fVar14;
    auVar45._4_4_ = fVar6 + fVar2 * fVar15;
    auVar45._8_4_ = fVar6 + fVar2 * fVar16;
    auVar45._12_4_ = fVar6 + fVar2 * fVar17;
    auVar45._16_4_ = fVar6 + fVar2 * fVar18;
    auVar45._20_4_ = fVar6 + fVar2 * fVar19;
    auVar45._24_4_ = fVar6 + fVar2 * fVar20;
    auVar45._28_4_ = fVar6 + auVar37._28_4_;
    auVar47._0_4_ = fVar1 + fVar3 * fVar14;
    auVar47._4_4_ = fVar1 + fVar3 * fVar15;
    auVar47._8_4_ = fVar1 + fVar3 * fVar16;
    auVar47._12_4_ = fVar1 + fVar3 * fVar17;
    auVar47._16_4_ = fVar1 + fVar3 * fVar18;
    auVar47._20_4_ = fVar1 + fVar3 * fVar19;
    auVar47._24_4_ = fVar1 + fVar3 * fVar20;
    auVar47._28_4_ = fVar1 + local_280._28_4_;
    auVar48._0_4_ = fVar5 + fVar4 * fVar14;
    auVar48._4_4_ = fVar5 + fVar4 * fVar15;
    auVar48._8_4_ = fVar5 + fVar4 * fVar16;
    auVar48._12_4_ = fVar5 + fVar4 * fVar17;
    auVar48._16_4_ = fVar5 + fVar4 * fVar18;
    auVar48._20_4_ = fVar5 + fVar4 * fVar19;
    auVar48._24_4_ = fVar5 + fVar4 * fVar20;
    auVar48._28_4_ = fVar5 + auVar23._28_4_;
    auVar35 = vsubps_avx(auVar45,auVar40);
    auVar37 = vsubps_avx(auVar47,auVar46);
    auVar39 = vsubps_avx(auVar48,local_340);
    auVar46._0_4_ =
         auVar35._0_4_ * auVar35._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar39._0_4_ * auVar39._0_4_;
    auVar46._4_4_ =
         auVar35._4_4_ * auVar35._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar39._4_4_ * auVar39._4_4_;
    auVar46._8_4_ =
         auVar35._8_4_ * auVar35._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar39._8_4_ * auVar39._8_4_;
    auVar46._12_4_ =
         auVar35._12_4_ * auVar35._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar39._12_4_ * auVar39._12_4_;
    auVar46._16_4_ =
         auVar35._16_4_ * auVar35._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar39._16_4_ * auVar39._16_4_;
    auVar46._20_4_ =
         auVar35._20_4_ * auVar35._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar39._20_4_ * auVar39._20_4_;
    auVar46._24_4_ =
         auVar35._24_4_ * auVar35._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar39._24_4_ * auVar39._24_4_;
    auVar46._28_4_ = auVar35._28_4_ + auVar37._28_4_ + auVar39._28_4_;
    auVar23._4_4_ = auVar41._4_4_ * auVar41._4_4_;
    auVar23._0_4_ = auVar41._0_4_ * auVar41._0_4_;
    auVar23._8_4_ = auVar41._8_4_ * auVar41._8_4_;
    auVar23._12_4_ = auVar41._12_4_ * auVar41._12_4_;
    auVar23._16_4_ = auVar41._16_4_ * auVar41._16_4_;
    auVar23._20_4_ = auVar41._20_4_ * auVar41._20_4_;
    auVar23._24_4_ = auVar41._24_4_ * auVar41._24_4_;
    auVar23._28_4_ = auVar41._28_4_;
    auVar35 = vcmpps_avx(auVar46,auVar23,1);
    auVar37 = auVar43 & auVar35;
    if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0x7f,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar37 >> 0xbf,0) != '\0') ||
        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar37[0x1f] < '\0')
    {
      auVar43 = vandps_avx(auVar43,auVar35);
      local_220 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_240 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_1e0 = local_280._0_8_;
      uStack_1d8 = local_280._8_8_;
      uStack_1d0 = local_280._16_8_;
      uStack_1c8 = local_280._24_8_;
      local_1a0 = local_260._0_8_;
      uStack_198 = local_260._8_8_;
      uStack_190 = local_260._16_8_;
      uStack_188 = local_260._24_8_;
      uVar29 = vmovmskps_avx(auVar43);
      uVar32 = CONCAT44((int)((ulong)lVar31 >> 0x20),uVar29);
      uVar24 = 1 << ((byte)k & 0x1f);
      auVar43 = vcmpps_avx(auVar48,auVar48,0xf);
      auVar49 = ZEXT3264(auVar43);
      auVar52 = ZEXT464(0) << 0x20;
      auVar54 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_348 = Disc;
      local_280 = auVar42;
      local_260 = auVar50;
      do {
        local_310.hit = local_180;
        local_310.valid = (int *)local_380;
        uVar25 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        uVar8 = *(uint *)(local_2c0 + uVar25 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar8].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar32 = uVar32 ^ 1L << (uVar25 & 0x3f);
        }
        else {
          local_340._0_8_ = uVar25;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_240 + uVar25 * 4);
          local_100 = *(undefined4 *)(local_220 + uVar25 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar25 * 4);
          local_310.context = context->user;
          local_e0 = (local_348->primIDs).field_0.i[uVar25];
          uVar29 = *(undefined4 *)((long)&local_1e0 + uVar25 * 4);
          uVar7 = *(undefined4 *)(local_1c0 + uVar25 * 4);
          local_160._4_4_ = uVar7;
          local_160._0_4_ = uVar7;
          local_160._8_4_ = uVar7;
          local_160._12_4_ = uVar7;
          local_160._16_4_ = uVar7;
          local_160._20_4_ = uVar7;
          local_160._24_4_ = uVar7;
          local_160._28_4_ = uVar7;
          local_b0 = vpshufd_avx(ZEXT416(uVar8),0);
          uVar7 = *(undefined4 *)((long)&local_1a0 + uVar25 * 4);
          local_140._4_4_ = uVar7;
          local_140._0_4_ = uVar7;
          local_140._8_4_ = uVar7;
          local_140._12_4_ = uVar7;
          local_140._16_4_ = uVar7;
          local_140._20_4_ = uVar7;
          local_140._24_4_ = uVar7;
          local_140._28_4_ = uVar7;
          local_180[0] = (RTCHitN)(char)uVar29;
          local_180[1] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar29;
          local_180[5] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar29;
          local_180[9] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar29;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar29;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar29;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar29;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar29;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar29 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          uStack_9c = (local_310.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_310.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_380 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar24 & 0xf) << 4));
          local_370 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar24 >> 4) * 0x10);
          local_310.geometryUserPtr = pGVar10->userPtr;
          local_310.N = 8;
          local_310.ray = (RTCRayN *)ray;
          if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2e0._0_8_ = uVar32;
            auVar43 = ZEXT1632(auVar49._0_16_);
            (*pGVar10->occlusionFilterN)(&local_310);
            auVar54 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar43 = vcmpps_avx(auVar43,auVar43,0xf);
            auVar49 = ZEXT3264(auVar43);
            uVar32 = local_2e0._0_8_;
          }
          auVar22 = vpcmpeqd_avx(auVar52._0_16_,local_380);
          auVar21 = vpcmpeqd_avx(auVar52._0_16_,local_370);
          auVar40._16_16_ = auVar21;
          auVar40._0_16_ = auVar22;
          auVar43 = auVar49._0_32_ & ~auVar40;
          if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar43 >> 0x7f,0) == '\0') &&
                (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar43 >> 0xbf,0) == '\0') &&
              (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar43[0x1f]) {
            auVar36._0_4_ = auVar22._0_4_ ^ auVar49._0_4_;
            auVar36._4_4_ = auVar22._4_4_ ^ auVar49._4_4_;
            auVar36._8_4_ = auVar22._8_4_ ^ auVar49._8_4_;
            auVar36._12_4_ = auVar22._12_4_ ^ auVar49._12_4_;
            auVar36._16_4_ = auVar21._0_4_ ^ auVar49._16_4_;
            auVar36._20_4_ = auVar21._4_4_ ^ auVar49._20_4_;
            auVar36._24_4_ = auVar21._8_4_ ^ auVar49._24_4_;
            auVar36._28_4_ = auVar21._12_4_ ^ auVar49._28_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              auVar43 = ZEXT1632(auVar49._0_16_);
              (*p_Var13)(&local_310);
              auVar54 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar43 = vcmpps_avx(auVar43,auVar43,0xf);
              auVar49 = ZEXT3264(auVar43);
            }
            auVar22 = vpcmpeqd_avx(auVar52._0_16_,local_380);
            auVar21 = vpcmpeqd_avx(auVar52._0_16_,local_370);
            auVar38._16_16_ = auVar21;
            auVar38._0_16_ = auVar22;
            auVar36._0_4_ = auVar22._0_4_ ^ auVar49._0_4_;
            auVar36._4_4_ = auVar22._4_4_ ^ auVar49._4_4_;
            auVar36._8_4_ = auVar22._8_4_ ^ auVar49._8_4_;
            auVar36._12_4_ = auVar22._12_4_ ^ auVar49._12_4_;
            auVar36._16_4_ = auVar21._0_4_ ^ auVar49._16_4_;
            auVar36._20_4_ = auVar21._4_4_ ^ auVar49._20_4_;
            auVar36._24_4_ = auVar21._8_4_ ^ auVar49._24_4_;
            auVar36._28_4_ = auVar21._12_4_ ^ auVar49._28_4_;
            auVar43 = vblendvps_avx(auVar54._0_32_,*(undefined1 (*) [32])(local_310.ray + 0x100),
                                    auVar38);
            *(undefined1 (*) [32])(local_310.ray + 0x100) = auVar43;
          }
          if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0x7f,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0xbf,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar36[0x1f] < '\0') {
            return true;
          }
          *(int *)(ray + k * 4 + 0x100) = local_2a0._0_4_;
          uVar32 = uVar32 ^ 1L << (local_340._0_8_ & 0x3f);
        }
      } while (uVar32 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }